

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  ThreadSafeArena *this_00;
  Extension *pEVar1;
  string *psVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  size_type sVar3;
  undefined8 uVar4;
  char *pcVar5;
  ThreadSafeArena *pTVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  anon_enum_32 local_44;
  anon_enum_32 local_40 [4];
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  this_00 = (ThreadSafeArena *)this->arena_;
  pTVar6 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar6 & 1) != 0) {
    pTVar6 = *(ThreadSafeArena **)((ulong)pTVar6 & 0xfffffffffffffffe);
  }
  if (pTVar6 != this_00 && pTVar6 != (ThreadSafeArena *)0x0) {
    pcVar5 = "message_arena == nullptr || message_arena == arena";
    sVar3 = 0x32;
    uVar4 = 0x2b5;
    goto LAB_00130dcc;
  }
  pVar7 = Insert(this,number);
  pEVar1 = pVar7.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->type = type;
    local_40[0] = anon_unknown_58::cpp_type(type);
    local_44 = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_40,&local_44,
                        "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 != (string *)0x0) {
      pcVar5 = (psVar2->_M_dataplus)._M_p;
      sVar3 = psVar2->_M_string_length;
      uVar4 = 0x2ba;
      goto LAB_00130dcc;
    }
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
LAB_00130d3d:
    if (pTVar6 == this_00) {
      pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
    }
    else if (pTVar6 == (ThreadSafeArena *)0x0) {
      pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
      ThreadSafeArena::AddCleanup
                (this_00,message,arena_delete_object<google::protobuf::MessageLite>);
    }
    else {
      this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)MessageLite::New(message,(Arena *)this_00);
      pEVar1->field_0 = this_01;
      MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_01,message);
    }
LAB_00130d8d:
    pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
    return;
  }
  local_40[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
  local_44 = OPTIONAL_FIELD;
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                     (local_40,&local_44,
                      "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                     );
  if (psVar2 == (string *)0x0) {
    local_40[0] = anon_unknown_58::cpp_type(pEVar1->type);
    local_44 = 10;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_40,&local_44,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (psVar2 == (string *)0x0) {
      if ((pEVar1->field_0xa & 4) != 0) {
        (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x30))
                  (*(long **)&(pEVar1->field_0).int32_t_value,message,this_00);
        goto LAB_00130d8d;
      }
      if ((this_00 == (ThreadSafeArena *)0x0) &&
         ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0)) {
        (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
      }
      goto LAB_00130d3d;
    }
  }
  pcVar5 = (psVar2->_M_dataplus)._M_p;
  sVar3 = psVar2->_M_string_length;
  uVar4 = 0x2c8;
LAB_00130dcc:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}